

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAdda<(moira::Instr)5,(moira::Mode)11,(moira::Size)4>(Moira *this,u16 opcode)

{
  ushort uVar1;
  PrefetchQueue PVar2;
  int iVar3;
  u32 uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(opcode >> 9 & 7);
  PVar2 = this->queue;
  readExt(this);
  uVar1 = (this->queue).irc;
  readExt(this);
  iVar3 = *(int *)((long)this->exec + uVar5 * 4 + -0x38);
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  (*this->_vptr_Moira[0x19])(this,2);
  (*this->_vptr_Moira[0x19])(this,2);
  *(uint *)((long)this->exec + uVar5 * 4 + -0x38) = ((uint)uVar1 | (int)PVar2 << 0x10) + iVar3;
  return;
}

Assistant:

void
Moira::execAdda(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    data = SEXT<S>(data);

    result = (I == ADDA) ? readA(dst) + data : readA(dst) - data;
    prefetch<POLLIPL>();

    sync(2);
    if (S == Word || isRegMode(M) || isImmMode(M)) sync(2);
    writeA(dst, result);
}